

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

int __thiscall TestHarness::PickType(TestHarness *this)

{
  uint uVar1;
  pointer pTVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  int *piVar9;
  bool bVar10;
  
  if (49999 < this->num_tests_) {
    return -1;
  }
  this->num_tests_ = this->num_tests_ + 1;
  iVar5 = this->total_weight_;
  if ((long)iVar5 < 1) {
    pcVar7 = "Check failed: total_weight_ > 0\n";
  }
  else {
    lVar3 = random();
    pTVar2 = (this->types_).
             super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(this->types_).
                  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar2;
    bVar10 = lVar6 != 0;
    if (bVar10) {
      uVar8 = (lVar6 >> 3) * -0x3333333333333333;
      iVar5 = (int)(lVar3 % (long)iVar5) - pTVar2->weight;
      if (iVar5 < 0) {
        uVar4 = 0;
      }
      else {
        piVar9 = &pTVar2[1].weight;
        uVar4 = 0;
        do {
          if ((uVar8 + (uVar8 == 0)) - 1 == uVar4) goto LAB_0010d8bd;
          uVar4 = uVar4 + 1;
          iVar5 = iVar5 - *piVar9;
          piVar9 = piVar9 + 10;
        } while (-1 < iVar5);
        bVar10 = uVar4 <= uVar8 && uVar8 - uVar4 != 0;
      }
      if (bVar10) {
        uVar1 = this->num_tests_;
        if ((uVar1 * 0xbcbe61d + 0xa7c50 >> 4 | uVar1 * -0x30000000) < 0x14f8b) {
          printf("  Test %d out of %d: %s\n",(ulong)uVar1,50000,
                 (pointer)pTVar2[uVar4].name._M_dataplus);
        }
        return (this->types_).
               super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4].type;
      }
    }
LAB_0010d8bd:
    pcVar7 = "Check failed: i < types_.size()\n";
  }
  syscall(1,2,pcVar7,0x20);
  abort();
}

Assistant:

int TestHarness::PickType() {
  if (num_tests_ >= FLAGS_numtests) return -1;
  num_tests_++;

  CHECK(total_weight_ > 0);
  // This is a little skewed if total_weight_ doesn't divide 2^31, but it's close
  int v = Uniform(total_weight_);
  int i;
  for (i = 0; i < types_.size(); i++) {
    v -= types_[i].weight;
    if (v < 0) {
      break;
    }
  }

  CHECK(i < types_.size());
  if ((num_tests_ % FLAGS_log_every_n_tests) == 0) {
    printf("  Test %d out of %d: %s\n",
            num_tests_, FLAGS_numtests, types_[i].name.c_str());
  }
  return types_[i].type;
}